

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
* embree::SceneGraph::transformMSMBlurVec3faBuffer
            (vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             *positions_in,Transformations *spaces)

{
  long in_RDX;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_RSI;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_RDI;
  size_t i_5;
  avector<Vec3fa> verts_1;
  AffineSpace3ff space;
  float time;
  size_t t;
  size_t j;
  avector<Vec3fa> verts;
  size_t i;
  size_t num_vertices;
  size_t num_time_steps;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *positions_out;
  size_t i_4;
  size_t i_1;
  size_t i_6;
  size_t i_7;
  size_t i_2;
  size_t i_3;
  value_type *in_stack_fffffffffffff308;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_fffffffffffff310;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *pvVar1;
  size_t in_stack_fffffffffffff318;
  void *in_stack_fffffffffffff340;
  Transformations *in_stack_fffffffffffff348;
  Transformations *pTVar2;
  float local_cb0;
  float local_ca4;
  float local_c9c;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_c28 [2];
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  ulong local_bd0;
  undefined1 local_bc8 [8];
  pointer local_bc0;
  pointer local_bb8;
  size_t local_bb0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_ba8 [2];
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  float local_b64;
  ulong local_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  ulong local_b00;
  undefined1 local_af8 [8];
  ulong local_af0;
  ulong local_ae8;
  void *local_ae0;
  ulong local_ad8;
  size_t local_ac0;
  size_type local_ab8;
  undefined1 local_aa9;
  long local_aa8;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *local_aa0;
  long local_a90;
  const_reference local_a88;
  undefined1 *local_a80;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *local_a70;
  size_t local_a60;
  undefined1 *local_a58;
  size_t local_a50;
  Transformations *local_a48;
  ulong local_a40;
  undefined1 *local_a38;
  ulong local_a30;
  undefined1 *local_a28;
  ulong local_a20;
  const_reference local_a18;
  ulong local_a10;
  const_reference local_a08;
  undefined8 *local_a00;
  undefined8 *local_9f8;
  undefined8 *local_9f0;
  undefined8 *local_9e8;
  long local_9e0;
  ulong local_9d8;
  long local_9d0;
  ulong local_9c8;
  long local_9c0;
  undefined8 *local_9b8;
  undefined8 *local_9b0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **local_9a8;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **local_9a0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **local_998;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **local_990;
  undefined8 *local_988;
  undefined8 *local_980;
  undefined8 *local_978;
  undefined8 *local_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 *local_950;
  undefined8 *local_948;
  undefined8 *local_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 *local_920;
  undefined8 *local_918;
  undefined8 *local_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 *local_8f0;
  undefined8 *local_8e8;
  undefined8 *local_8e0;
  undefined8 *local_8c0;
  undefined8 *local_8b8;
  undefined8 *local_8b0;
  undefined8 *local_890;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **local_888;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **local_880;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **local_860;
  undefined8 *local_858;
  undefined8 *local_850;
  undefined8 *local_830;
  undefined8 *local_828;
  undefined8 *local_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 *local_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  Vec3fa *local_7a0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **local_798;
  undefined8 *local_790;
  float local_784;
  undefined8 *local_780;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float local_768;
  float local_764;
  undefined8 *local_760;
  float local_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float local_748;
  float local_744;
  undefined8 *local_740;
  float local_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float local_728;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 *local_700;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **local_6f8;
  undefined8 *local_6f0;
  undefined8 *local_6e8;
  undefined8 *local_6e0;
  undefined8 *local_6d8;
  undefined8 *local_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  float local_6a8;
  float fStack_6a4;
  float fStack_6a0;
  float fStack_69c;
  undefined8 *local_698;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **local_690;
  undefined8 *local_688;
  undefined8 *local_680;
  undefined8 local_678;
  float fStack_670;
  float fStack_66c;
  undefined8 local_668;
  undefined8 uStack_660;
  float local_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  undefined8 *local_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 *local_620;
  undefined8 *local_618;
  undefined8 *local_610;
  undefined8 *local_608;
  undefined8 *local_600;
  undefined8 *local_5f8;
  undefined8 *local_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  undefined8 *local_5b8;
  undefined8 *local_5b0;
  undefined8 *local_5a8;
  undefined8 *local_5a0;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  undefined8 local_588;
  undefined8 uStack_580;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  undefined8 *local_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 *local_540;
  undefined8 *local_538;
  undefined8 *local_530;
  undefined8 *local_528;
  undefined8 *local_520;
  undefined8 *local_518;
  undefined8 *local_510;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined8 *local_4d8;
  undefined8 *local_4d0;
  undefined8 *local_4c8;
  undefined8 *local_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  undefined8 *local_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  Vec3fa *local_420;
  undefined8 *local_418;
  undefined8 *local_410;
  float local_404;
  undefined8 *local_400;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float local_3e4;
  undefined8 *local_3e0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float local_3c4;
  undefined8 *local_3c0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 *local_380;
  undefined8 *local_378;
  undefined8 *local_370;
  undefined8 *local_368;
  undefined8 *local_360;
  undefined8 *local_358;
  undefined8 *local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined8 *local_318;
  undefined8 *local_310;
  undefined8 *local_308;
  undefined8 *local_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 *local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined8 *local_238;
  undefined8 *local_230;
  undefined8 *local_228;
  undefined8 *local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 *local_158;
  undefined8 *local_150;
  undefined8 *local_148;
  undefined8 *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined8 *local_108;
  ulong local_100;
  size_t local_f8;
  Transformations *local_f0;
  long local_e8;
  size_t local_e0;
  Transformations *local_d8;
  ulong local_d0;
  size_t local_c8;
  undefined1 *local_c0;
  void *local_b8;
  size_t local_b0;
  undefined1 *local_a8;
  pointer local_90;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *local_88;
  ulong local_70;
  undefined1 *local_68;
  ulong local_60;
  void *local_58;
  undefined1 *local_50;
  pointer local_30;
  size_t local_28;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *local_20;
  
  local_aa9 = 0;
  local_aa8 = in_RDX;
  local_aa0 = in_RSI;
  std::
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ::vector((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            *)0x3178bf);
  local_ab8 = std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::size(local_aa0);
  local_a88 = std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::operator[](local_aa0,0);
  local_ac0 = local_a88->size_active;
  if (local_ab8 == 1) {
    local_ad8 = 0;
    while( true ) {
      local_a90 = local_aa8;
      local_9e0 = local_aa8 + 8;
      if (*(ulong *)(local_aa8 + 0x10) <= local_ad8) break;
      local_a58 = local_af8;
      local_a60 = local_ac0;
      local_af0 = 0;
      local_ae8 = 0;
      local_ae0 = (void *)0x0;
      local_c8 = local_ac0;
      local_c0 = local_a58;
      if (local_ac0 != 0) {
        local_b0 = local_ac0;
        local_a8 = local_a58;
        local_ae0 = alignedMalloc(in_stack_fffffffffffff318,(size_t)in_stack_fffffffffffff310);
        for (local_d0 = 0; local_d0 < local_c8; local_d0 = local_d0 + 1) {
          local_b8 = (void *)((long)local_ae0 + local_d0 * 0x10);
        }
        local_ae8 = local_c8;
      }
      local_af0 = local_ae8;
      for (local_b00 = 0; local_b00 < local_ac0; local_b00 = local_b00 + 1) {
        local_9d0 = local_aa8;
        local_9d8 = local_ad8;
        local_9c0 = local_aa8 + 8;
        local_9c8 = local_ad8;
        local_9b8 = (undefined8 *)(*(long *)(local_aa8 + 0x20) + local_ad8 * 0x40);
        local_9b0 = &local_b58;
        local_908 = *local_9b8;
        uStack_900 = local_9b8[1];
        local_940 = &local_b48;
        local_948 = local_9b8 + 2;
        local_938 = *local_948;
        uStack_930 = local_9b8[3];
        local_970 = &local_b38;
        local_978 = local_9b8 + 4;
        local_968 = *local_978;
        uStack_960 = local_9b8[5];
        local_820 = &local_b28;
        local_828 = local_9b8 + 6;
        local_818 = *local_828;
        uStack_810 = local_9b8[7];
        local_988 = local_9b8;
        local_980 = local_9b0;
        local_950 = local_970;
        local_920 = local_940;
        local_918 = local_9b8;
        local_910 = local_9b0;
        local_8f0 = local_9b0;
        local_800 = local_820;
        local_b58 = local_908;
        uStack_b50 = uStack_900;
        local_b48 = local_938;
        uStack_b40 = uStack_930;
        local_b38 = local_968;
        uStack_b30 = uStack_960;
        local_b28 = local_818;
        uStack_b20 = uStack_810;
        local_a08 = std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::operator[](local_aa0,0);
        local_a10 = local_b00;
        local_420 = local_a08->items + local_b00;
        local_410 = &local_b18;
        local_418 = &local_b58;
        local_404 = (local_420->field_0).m128[0];
        local_400 = &local_438;
        local_2e8 = CONCAT44(local_404,local_404);
        uStack_2e0 = CONCAT44(local_404,local_404);
        local_3e4 = (local_420->field_0).m128[1];
        local_3e0 = &local_458;
        local_208 = CONCAT44(local_3e4,local_3e4);
        uStack_200 = CONCAT44(local_3e4,local_3e4);
        local_298 = &local_b48;
        local_3c4 = (local_420->field_0).m128[2];
        local_3c0 = &local_478;
        local_128 = CONCAT44(local_3c4,local_3c4);
        uStack_120 = CONCAT44(local_3c4,local_3c4);
        local_1b8 = &local_b38;
        local_1c0 = &local_b28;
        local_1a8 = &local_468;
        local_1b0 = &local_478;
        local_140 = &local_1d8;
        local_138._0_4_ = (float)local_b38;
        local_138._4_4_ = (float)((ulong)local_b38 >> 0x20);
        uStack_130._0_4_ = (float)uStack_b30;
        uStack_130._4_4_ = (float)((ulong)uStack_b30 >> 0x20);
        local_118 = local_3c4 * (float)local_138;
        fStack_114 = local_3c4 * local_138._4_4_;
        fStack_110 = local_3c4 * (float)uStack_130;
        fStack_10c = local_3c4 * uStack_130._4_4_;
        local_108 = &local_1d8;
        local_178 = CONCAT44(fStack_114,local_118);
        uStack_170 = CONCAT44(fStack_10c,fStack_110);
        local_190 = &local_468;
        local_198 = &local_1d8;
        local_188._0_4_ = (float)local_b28;
        local_188._4_4_ = (float)((ulong)local_b28 >> 0x20);
        uStack_180._0_4_ = (float)uStack_b20;
        uStack_180._4_4_ = (float)((ulong)uStack_b20 >> 0x20);
        local_168 = local_118 + (float)local_188;
        fStack_164 = fStack_114 + local_188._4_4_;
        fStack_160 = fStack_110 + (float)uStack_180;
        fStack_15c = fStack_10c + uStack_180._4_4_;
        local_158 = &local_468;
        local_288 = &local_448;
        local_290 = &local_458;
        local_2a0 = &local_468;
        local_220 = &local_2b8;
        local_218._0_4_ = (float)local_b48;
        local_218._4_4_ = (float)((ulong)local_b48 >> 0x20);
        uStack_210._0_4_ = (float)uStack_b40;
        uStack_210._4_4_ = (float)((ulong)uStack_b40 >> 0x20);
        local_1f8 = local_3e4 * (float)local_218;
        fStack_1f4 = local_3e4 * local_218._4_4_;
        fStack_1f0 = local_3e4 * (float)uStack_210;
        fStack_1ec = local_3e4 * uStack_210._4_4_;
        local_1e0 = &local_2b8;
        local_258 = CONCAT44(fStack_1f4,local_1f8);
        uStack_250 = CONCAT44(fStack_1ec,fStack_1f0);
        local_270 = &local_448;
        local_278 = &local_2b8;
        local_268._0_4_ = (float)local_468;
        local_268._4_4_ = (float)((ulong)local_468 >> 0x20);
        uStack_260._0_4_ = (float)uStack_460;
        uStack_260._4_4_ = (float)((ulong)uStack_460 >> 0x20);
        local_248 = local_1f8 + (float)local_268;
        fStack_244 = fStack_1f4 + local_268._4_4_;
        fStack_240 = fStack_1f0 + (float)uStack_260;
        fStack_23c = fStack_1ec + uStack_260._4_4_;
        local_238 = &local_448;
        local_368 = &local_b18;
        local_370 = &local_438;
        local_380 = &local_448;
        local_300 = &local_398;
        local_2f8._0_4_ = (float)local_b58;
        local_2f8._4_4_ = (float)((ulong)local_b58 >> 0x20);
        uStack_2f0._0_4_ = (float)uStack_b50;
        uStack_2f0._4_4_ = (float)((ulong)uStack_b50 >> 0x20);
        local_2d8 = local_404 * (float)local_2f8;
        fStack_2d4 = local_404 * local_2f8._4_4_;
        fStack_2d0 = local_404 * (float)uStack_2f0;
        fStack_2cc = local_404 * uStack_2f0._4_4_;
        local_2c0 = &local_398;
        local_338 = CONCAT44(fStack_2d4,local_2d8);
        uStack_330 = CONCAT44(fStack_2cc,fStack_2d0);
        local_350 = &local_b18;
        local_358 = &local_398;
        local_348._0_4_ = (float)local_448;
        local_348._4_4_ = (float)((ulong)local_448 >> 0x20);
        uStack_340._0_4_ = (float)uStack_440;
        uStack_340._4_4_ = (float)((ulong)uStack_440 >> 0x20);
        local_328 = local_2d8 + (float)local_348;
        fStack_324 = fStack_2d4 + local_348._4_4_;
        fStack_320 = fStack_2d0 + (float)uStack_340;
        fStack_31c = fStack_2cc + uStack_340._4_4_;
        local_318 = &local_b18;
        local_b18 = CONCAT44(fStack_324,local_328);
        uStack_b10 = CONCAT44(fStack_31c,fStack_320);
        local_a30 = local_b00;
        local_a28 = local_af8;
        local_9e8 = (undefined8 *)((long)local_ae0 + local_b00 * 0x10);
        local_9f0 = &local_b18;
        *local_9e8 = local_b18;
        local_9e8[1] = uStack_b10;
        local_3f8 = local_404;
        fStack_3f4 = local_404;
        fStack_3f0 = local_404;
        fStack_3ec = local_404;
        local_3e8 = local_404;
        local_3d8 = local_3e4;
        fStack_3d4 = local_3e4;
        fStack_3d0 = local_3e4;
        fStack_3cc = local_3e4;
        local_3c8 = local_3e4;
        local_3b8 = local_3c4;
        fStack_3b4 = local_3c4;
        fStack_3b0 = local_3c4;
        fStack_3ac = local_3c4;
        local_3a8 = local_3c4;
        local_378 = local_418;
        local_360 = local_380;
        local_348 = local_448;
        uStack_340 = uStack_440;
        local_310 = local_418;
        local_308 = local_370;
        local_2f8 = local_b58;
        uStack_2f0 = uStack_b50;
        local_280 = local_2a0;
        local_268 = local_468;
        uStack_260 = uStack_460;
        local_230 = local_298;
        local_228 = local_290;
        local_218 = local_b48;
        uStack_210 = uStack_b40;
        local_1a0 = local_1c0;
        local_188 = local_b28;
        uStack_180 = uStack_b20;
        local_150 = local_1b8;
        local_148 = local_1b0;
        local_138 = local_b38;
        uStack_130 = uStack_b30;
        local_478 = local_128;
        uStack_470 = uStack_120;
        local_468 = CONCAT44(fStack_164,local_168);
        uStack_460 = CONCAT44(fStack_15c,fStack_160);
        local_458 = local_208;
        uStack_450 = uStack_200;
        local_448 = CONCAT44(fStack_244,local_248);
        uStack_440 = CONCAT44(fStack_23c,fStack_240);
        local_438 = local_2e8;
        uStack_430 = uStack_2e0;
        local_398 = local_338;
        uStack_390 = uStack_330;
        local_2b8 = local_258;
        uStack_2b0 = uStack_250;
        local_1d8 = local_178;
        uStack_1d0 = uStack_170;
      }
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::push_back(in_stack_fffffffffffff310,in_stack_fffffffffffff308);
      local_a80 = local_af8;
      for (local_70 = 0; local_70 < local_af0; local_70 = local_70 + 1) {
      }
      local_60 = local_ae8;
      local_58 = local_ae0;
      local_68 = local_a80;
      local_50 = local_a80;
      alignedFree(in_stack_fffffffffffff308);
      local_ad8 = local_ad8 + 1;
    }
  }
  else {
    for (local_b60 = 0; local_b60 < local_ab8; local_b60 = local_b60 + 1) {
      if (local_ab8 < 2) {
        local_cb0 = 0.0;
      }
      else {
        local_c9c = (float)local_b60;
        local_ca4 = (float)(local_ab8 - 1);
        local_cb0 = local_c9c / local_ca4;
      }
      local_b64 = local_cb0;
      Transformations::interpolate
                (in_stack_fffffffffffff348,(float)((ulong)in_stack_fffffffffffff340 >> 0x20));
      in_stack_fffffffffffff348 = (Transformations *)local_bc8;
      local_a50 = local_ac0;
      local_bc0 = (pointer)0x0;
      local_bb8 = (pointer)0x0;
      local_bb0 = 0;
      local_f8 = local_ac0;
      local_a48 = in_stack_fffffffffffff348;
      local_f0 = in_stack_fffffffffffff348;
      if (local_ac0 != 0) {
        local_e0 = local_ac0;
        local_d8 = in_stack_fffffffffffff348;
        in_stack_fffffffffffff340 =
             alignedMalloc(in_stack_fffffffffffff318,(size_t)in_stack_fffffffffffff310);
        (in_stack_fffffffffffff348->spaces).size_alloced = (size_t)in_stack_fffffffffffff340;
        for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
          local_e8 = (in_stack_fffffffffffff348->spaces).size_alloced + local_100 * 0x10;
        }
        pTVar2 = in_stack_fffffffffffff348;
        *(size_t *)&in_stack_fffffffffffff348->spaces = local_f8;
        (in_stack_fffffffffffff348->spaces).size_active = local_f8;
        in_stack_fffffffffffff348 = pTVar2;
      }
      for (local_bd0 = 0; local_bd0 < local_ac0; local_bd0 = local_bd0 + 1) {
        local_9a0 = local_c28;
        local_9a8 = local_ba8;
        local_c28[0] = local_ba8[0];
        local_c28[1] = local_ba8[1];
        local_8b0 = &local_c18;
        local_8b8 = &local_b98;
        local_c18 = local_b98;
        uStack_c10 = uStack_b90;
        local_8e0 = &local_c08;
        local_8e8 = &local_b88;
        local_c08 = local_b88;
        uStack_c00 = uStack_b80;
        local_850 = &local_bf8;
        local_858 = &local_b78;
        local_bf8 = local_b78;
        uStack_bf0 = uStack_b70;
        local_998 = local_9a8;
        local_990 = local_9a0;
        local_8c0 = local_8e0;
        local_890 = local_8b0;
        local_888 = local_9a8;
        local_880 = local_9a0;
        local_860 = local_9a0;
        local_830 = local_850;
        local_a18 = std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::operator[](local_aa0,local_b60);
        local_a20 = local_bd0;
        local_7a0 = local_a18->items + local_bd0;
        local_790 = &local_be8;
        local_798 = local_c28;
        local_784 = (local_7a0->field_0).m128[0];
        local_780 = &local_7b8;
        local_668 = CONCAT44(local_784,local_784);
        uStack_660 = CONCAT44(local_784,local_784);
        local_764 = (local_7a0->field_0).m128[1];
        local_760 = &local_7d8;
        local_588 = CONCAT44(local_764,local_764);
        uStack_580 = CONCAT44(local_764,local_764);
        local_618 = &local_c18;
        local_744 = (local_7a0->field_0).m128[2];
        local_740 = &local_7f8;
        local_4a8 = CONCAT44(local_744,local_744);
        uStack_4a0 = CONCAT44(local_744,local_744);
        local_538 = &local_c08;
        local_540 = &local_bf8;
        local_528 = &local_7e8;
        local_530 = &local_7f8;
        local_4c0 = &local_558;
        local_4b8 = (float)local_c08;
        fStack_4b4 = (float)((ulong)local_c08 >> 0x20);
        fStack_4b0 = (float)uStack_c00;
        fStack_4ac = (float)((ulong)uStack_c00 >> 0x20);
        local_498 = local_744 * local_4b8;
        fStack_494 = local_744 * fStack_4b4;
        fStack_490 = local_744 * fStack_4b0;
        fStack_48c = local_744 * fStack_4ac;
        local_480 = &local_558;
        local_4f8 = CONCAT44(fStack_494,local_498);
        uStack_4f0 = CONCAT44(fStack_48c,fStack_490);
        local_510 = &local_7e8;
        local_518 = &local_558;
        local_508 = (float)local_bf8;
        fStack_504 = (float)((ulong)local_bf8 >> 0x20);
        fStack_500 = (float)uStack_bf0;
        fStack_4fc = (float)((ulong)uStack_bf0 >> 0x20);
        local_4e8 = local_498 + local_508;
        fStack_4e4 = fStack_494 + fStack_504;
        fStack_4e0 = fStack_490 + fStack_500;
        fStack_4dc = fStack_48c + fStack_4fc;
        local_4d8 = &local_7e8;
        local_608 = &local_7c8;
        local_610 = &local_7d8;
        local_620 = &local_7e8;
        local_5a0 = &local_638;
        local_598 = (float)local_c18;
        fStack_594 = (float)((ulong)local_c18 >> 0x20);
        fStack_590 = (float)uStack_c10;
        fStack_58c = (float)((ulong)uStack_c10 >> 0x20);
        local_578 = local_764 * local_598;
        fStack_574 = local_764 * fStack_594;
        fStack_570 = local_764 * fStack_590;
        fStack_56c = local_764 * fStack_58c;
        local_560 = &local_638;
        local_5d8 = CONCAT44(fStack_574,local_578);
        uStack_5d0 = CONCAT44(fStack_56c,fStack_570);
        local_5f0 = &local_7c8;
        local_5f8 = &local_638;
        local_5e8._0_4_ = (float)local_7e8;
        local_5e8._4_4_ = (float)((ulong)local_7e8 >> 0x20);
        uStack_5e0._0_4_ = (float)uStack_7e0;
        uStack_5e0._4_4_ = (float)((ulong)uStack_7e0 >> 0x20);
        local_5c8 = local_578 + (float)local_5e8;
        fStack_5c4 = fStack_574 + local_5e8._4_4_;
        fStack_5c0 = fStack_570 + (float)uStack_5e0;
        fStack_5bc = fStack_56c + uStack_5e0._4_4_;
        local_5b8 = &local_7c8;
        local_6e8 = &local_be8;
        local_6f0 = &local_7b8;
        local_700 = &local_7c8;
        local_680 = &local_718;
        local_678._0_4_ = SUB84(local_c28[0],0);
        local_678._4_4_ = (float)((ulong)local_c28[0] >> 0x20);
        fStack_670 = SUB84(local_c28[1],0);
        fStack_66c = (float)((ulong)local_c28[1] >> 0x20);
        local_658 = local_784 * (float)local_678;
        fStack_654 = local_784 * local_678._4_4_;
        fStack_650 = local_784 * fStack_670;
        fStack_64c = local_784 * fStack_66c;
        local_640 = &local_718;
        local_6b8 = CONCAT44(fStack_654,local_658);
        uStack_6b0 = CONCAT44(fStack_64c,fStack_650);
        local_6d0 = &local_be8;
        local_6d8 = &local_718;
        local_6c8._0_4_ = (float)local_7c8;
        local_6c8._4_4_ = (float)((ulong)local_7c8 >> 0x20);
        uStack_6c0._0_4_ = (float)uStack_7c0;
        uStack_6c0._4_4_ = (float)((ulong)uStack_7c0 >> 0x20);
        local_6a8 = local_658 + (float)local_6c8;
        fStack_6a4 = fStack_654 + local_6c8._4_4_;
        fStack_6a0 = fStack_650 + (float)uStack_6c0;
        fStack_69c = fStack_64c + uStack_6c0._4_4_;
        local_698 = &local_be8;
        local_be8 = CONCAT44(fStack_6a4,local_6a8);
        uStack_be0 = CONCAT44(fStack_69c,fStack_6a0);
        local_a40 = local_bd0;
        local_a38 = local_bc8;
        local_9f8 = (undefined8 *)(local_bb0 + local_bd0 * 0x10);
        local_a00 = &local_be8;
        *local_9f8 = local_be8;
        local_9f8[1] = uStack_be0;
        local_778 = local_784;
        fStack_774 = local_784;
        fStack_770 = local_784;
        fStack_76c = local_784;
        local_768 = local_784;
        local_758 = local_764;
        fStack_754 = local_764;
        fStack_750 = local_764;
        fStack_74c = local_764;
        local_748 = local_764;
        local_738 = local_744;
        fStack_734 = local_744;
        fStack_730 = local_744;
        fStack_72c = local_744;
        local_728 = local_744;
        local_6f8 = local_798;
        local_6e0 = local_700;
        local_6c8 = local_7c8;
        uStack_6c0 = uStack_7c0;
        local_690 = local_798;
        local_688 = local_6f0;
        local_678 = local_c28[0];
        _fStack_670 = local_c28[1];
        local_600 = local_620;
        local_5e8 = local_7e8;
        uStack_5e0 = uStack_7e0;
        local_5b0 = local_618;
        local_5a8 = local_610;
        local_520 = local_540;
        local_4d0 = local_538;
        local_4c8 = local_530;
        local_7f8 = local_4a8;
        uStack_7f0 = uStack_4a0;
        local_7e8 = CONCAT44(fStack_4e4,local_4e8);
        uStack_7e0 = CONCAT44(fStack_4dc,fStack_4e0);
        local_7d8 = local_588;
        uStack_7d0 = uStack_580;
        local_7c8 = CONCAT44(fStack_5c4,local_5c8);
        uStack_7c0 = CONCAT44(fStack_5bc,fStack_5c0);
        local_7b8 = local_668;
        uStack_7b0 = uStack_660;
        local_718 = local_6b8;
        uStack_710 = uStack_6b0;
        local_638 = local_5d8;
        uStack_630 = uStack_5d0;
        local_558 = local_4f8;
        uStack_550 = uStack_4f0;
      }
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::push_back(in_stack_fffffffffffff310,in_stack_fffffffffffff308);
      pvVar1 = (vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                *)local_bc8;
      for (local_90 = (pointer)0x0; local_90 < local_bc0; local_90 = (pointer)&local_90->field_0x1)
      {
      }
      local_30 = local_bb8;
      local_28 = local_bb0;
      local_a70 = pvVar1;
      local_88 = pvVar1;
      local_20 = pvVar1;
      alignedFree(in_stack_fffffffffffff308);
      in_stack_fffffffffffff310 = pvVar1;
      pvVar1[1].
      super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar1->
      super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pvVar1->
      super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    }
  }
  return in_RDI;
}

Assistant:

inline std::vector<avector<Vec3fa>> transformMSMBlurVec3faBuffer(const std::vector<avector<Vec3fa>>& positions_in, const Transformations& spaces)
    {
      std::vector<avector<Vec3fa>> positions_out;
      const size_t num_time_steps = positions_in.size(); assert(num_time_steps);
      const size_t num_vertices = positions_in[0].size();

      /* if we have only one set of vertices, use transformation to generate more vertex sets */
      if (num_time_steps == 1)
      {
        for (size_t i=0; i<spaces.size(); i++) 
        {
          avector<Vec3fa> verts(num_vertices);
          for (size_t j=0; j<num_vertices; j++) {
            verts[j] = xfmPoint((AffineSpace3fa)spaces[i],positions_in[0][j]);
          }
          positions_out.push_back(std::move(verts));
        }
      } 
      /* otherwise transform all vertex sets with interpolated transformation */
      else
      {
        for (size_t t=0; t<num_time_steps; t++) 
        {
          float time = num_time_steps > 1 ? float(t)/float(num_time_steps-1) : 0.0f;
          const AffineSpace3ff space = spaces.interpolate(time);
          avector<Vec3fa> verts(num_vertices);
          for (size_t i=0; i<num_vertices; i++) {
            verts[i] = xfmPoint ((AffineSpace3fa)space,positions_in[t][i]);
          }
          positions_out.push_back(std::move(verts));
        }
      }
      return positions_out;
    }